

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O2

void __thiscall rsg::VariableScope::removeLive(VariableScope *this,Variable *variable)

{
  __normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  __position;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<rsg::Variable**,std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::Variable_const*const>>
                         ((this->m_liveVariables).
                          super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (this->m_liveVariables).
                          super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::erase
            (&this->m_liveVariables,(const_iterator)__position._M_current);
  return;
}

Assistant:

void VariableScope::removeLive (const Variable* variable)
{
	vector<Variable*>::iterator pos = std::find(m_liveVariables.begin(), m_liveVariables.end(), variable);
	DE_ASSERT(pos != m_liveVariables.end());

	// \todo [pyry] Not so efficient
	m_liveVariables.erase(pos);
}